

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

string * flatbuffers::NumToString<float>(string *__return_storage_ptr__,float t)

{
  stringstream ss;
  stringstream local_190 [128];
  ios_base local_110 [264];
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::ostream::_M_insert<double>((double)t);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  return __return_storage_ptr__;
}

Assistant:

std::string NumToString(T t) {
  // to_string() prints different numbers of digits for floats depending on
  // platform and isn't available on Android, so we use stringstream
  std::stringstream ss;
  if (sizeof(T) > 1) ss << t;
  else ss << static_cast<int>(t);  // Avoid char types used as character data.
  return ss.str();
}